

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
::binary_search_impl<std::pair<int,int>,phmap::Less<std::pair<int,int>>>
          (btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
           *this,pair<int,_int> *k,int s,int e)

{
  bool bVar1;
  template_ElementType<2UL> *ptVar2;
  int iVar3;
  
  while (iVar3 = e, s != iVar3) {
    e = s + iVar3 >> 1;
    ptVar2 = GetField<2ul>(this);
    bVar1 = std::operator<(ptVar2 + e,k);
    if (bVar1) {
      s = e + 1;
      e = iVar3;
    }
  }
  return (SearchResult<int,_false>)iVar3;
}

Assistant:

SearchResult<int, false> binary_search_impl(
            const K &k, int s, int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s != e) {
                const int mid = (s + e) >> 1;
                if (comp(key(mid), k)) {
                    s = mid + 1;
                } else {
                    e = mid;
                }
            }
            return {s};
        }